

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

Atom_p __thiscall indigox::Molecule::NewAtom(Molecule *this)

{
  Atom_p *atm_00;
  element_type *this_00;
  MolecularGraph *this_01;
  shared_ptr<indigox::Atom> *__args;
  element_type *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Atom *in_RDI;
  Atom_p AVar1;
  Atom_p *atm;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  shared_ptr<indigox::Atom> *in_stack_ffffffffffffff20;
  shared_ptr<indigox::Atom> *in_stack_ffffffffffffff28;
  unordered_map<unsigned_long,_std::weak_ptr<indigox::Atom>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Atom>_>_>_>
  *in_stack_ffffffffffffff30;
  Atom *this_03;
  
  this_03 = in_RDI;
  operator_new(0x90);
  std::enable_shared_from_this<indigox::Molecule>::shared_from_this
            ((enable_shared_from_this<indigox::Molecule> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  Atom::Atom(this_03,(Molecule_p *)in_RDI);
  std::shared_ptr<indigox::Atom>::shared_ptr<indigox::Atom,void>
            (in_stack_ffffffffffffff20,
             (Atom *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x110fa2);
  std::vector<std::shared_ptr<indigox::Atom>,std::allocator<std::shared_ptr<indigox::Atom>>>::
  emplace_back<std::shared_ptr<indigox::Atom>&>
            ((vector<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
              *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  atm_00 = (Atom_p *)(in_RSI + 0x70);
  this_00 = std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x110fcf);
  this_01 = (MolecularGraph *)Atom::GetIndex(this_00);
  std::
  unordered_map<unsigned_long,std::weak_ptr<indigox::Atom>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Atom>>>>
  ::emplace<unsigned_long,std::shared_ptr<indigox::Atom>&>
            (in_stack_ffffffffffffff30,(unsigned_long *)in_stack_ffffffffffffff28,
             in_stack_ffffffffffffff20);
  __args = (shared_ptr<indigox::Atom> *)(in_RSI + 0xe0);
  this_02 = std::
            __shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x111044);
  std::shared_ptr<indigox::Atom>::shared_ptr
            (in_stack_ffffffffffffff20,
             (shared_ptr<indigox::Atom> *)
             CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
  MolecularGraph::AddVertex(this_01,atm_00);
  std::
  map<std::shared_ptr<indigox::Atom>,void*,std::less<std::shared_ptr<indigox::Atom>>,std::allocator<std::pair<std::shared_ptr<indigox::Atom>const,void*>>>
  ::emplace<std::shared_ptr<indigox::Atom>&,void*>
            ((map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
              *)this_02,__args,(void **)in_stack_ffffffffffffff20);
  std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x1110c4);
  *(undefined1 *)(in_RSI + 0x158) = 1;
  AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_03;
  return (Atom_p)AVar1.super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Atom_p Molecule::NewAtom() {
  Atom_p atm = Atom_p(new Atom(shared_from_this()));
  atoms_.emplace_back(atm);
  idx_to_atom_.emplace(atm->GetIndex(), atm);
  atom_to_vertex_.emplace(atm, graph_->AddVertex(atm));
  modified_ = true;
  return atm;
}